

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.h
# Opt level: O1

void __thiscall
ThreadContext::QueueFreeOldEntryPointInfoIfInScript
          (ThreadContext *this,FunctionEntryPointInfo *oldEntryPointInfo)

{
  FunctionEntryPointInfo *pFVar1;
  State SVar2;
  RecyclableData *pRVar3;
  
  if ((this->callRootLevel != 0) &&
     ((oldEntryPointInfo->nextEntryPoint).ptr == (FunctionEntryPointInfo *)0x0)) {
    SVar2 = Js::EntryPointInfo::GetState(&oldEntryPointInfo->super_EntryPointInfo);
    if (SVar2 != CleanedUp) {
      pRVar3 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      pFVar1 = (pRVar3->oldEntryPointInfo).ptr;
      Memory::Recycler::WBSetBit((char *)&oldEntryPointInfo->nextEntryPoint);
      (oldEntryPointInfo->nextEntryPoint).ptr = pFVar1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&oldEntryPointInfo->nextEntryPoint);
      pRVar3 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      Memory::Recycler::WBSetBit((char *)&pRVar3->oldEntryPointInfo);
      (pRVar3->oldEntryPointInfo).ptr = oldEntryPointInfo;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&pRVar3->oldEntryPointInfo);
      return;
    }
  }
  return;
}

Assistant:

void QueueFreeOldEntryPointInfoIfInScript(Js::FunctionEntryPointInfo* oldEntryPointInfo)
    {
        if (this->IsInScript())
        {
            // Add it to the list only if it's not already in it
            if (oldEntryPointInfo->nextEntryPoint == nullptr && !oldEntryPointInfo->IsCleanedUp())
            {
                oldEntryPointInfo->nextEntryPoint = recyclableData->oldEntryPointInfo;
                recyclableData->oldEntryPointInfo = oldEntryPointInfo;
            }
        }
    }